

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O1

unsigned_long bitcrc32(unsigned_long c,void *_p,size_t s)

{
  byte bVar1;
  ulong uVar2;
  
  if (_p == (void *)0x0) {
    return 0;
  }
  if (s != 0) {
    do {
      c = c ^ *_p;
      bVar1 = 9;
      do {
        uVar2 = c >> 1 ^ 0xedb88320;
        if ((c & 1) != 0) {
          uVar2 = c >> 1;
        }
        c = uVar2 ^ 0x80000000;
        bVar1 = bVar1 - 1;
      } while (1 < bVar1);
      _p = (void *)((long)_p + 1);
      s = s - 1;
    } while (s != 0);
  }
  return c;
}

Assistant:

unsigned long
bitcrc32(unsigned long c, const void *_p, size_t s)
{
	/* This is a drop-in replacement for crc32() from zlib.
	 * Libarchive should be able to correctly read archives (including
	 * correct CRCs) even when zlib is unavailable, and this function
	 * helps us verify that. Yes, this is very, very slow and unsuitable
	 * for production use, but it's obviously correct, compact, and
	 * works well enough for this particular usage. Libarchive
	 * internally uses a much more efficient implementation if zlib is
	 * unavailable. */
	const unsigned char *p = _p;
	char bitctr;

	if (p == NULL)
		return (0);

	for (; s > 0; --s) {
		c ^= *p++;
		for (bitctr = 8; bitctr > 0; --bitctr) {
			if (c & 1) c = (c >> 1);
			else	   c = (c >> 1) ^ 0xedb88320;
			c ^= 0x80000000;
		}
	}
	return (c);
}